

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

void __thiscall SQClosure::Mark(SQClosure *this,SQCollectable **chain)

{
  SQWeakRef *pSVar1;
  SQCollectable_conflict *pSVar2;
  SQCollectable_conflict **in_RSI;
  SQCollectable_conflict *in_RDI;
  SQInteger k;
  SQInteger i;
  SQFunctionProto *fp;
  SQCollectable_conflict **in_stack_ffffffffffffffc8;
  long local_28;
  long local_20;
  
  if ((((SQObjectValue *)&(in_RDI->super_SQRefCounted)._uiRef)->nInteger & 0x80000000U) == 0) {
    ((SQObjectValue *)&(in_RDI->super_SQRefCounted)._uiRef)->nInteger =
         ((SQObjectValue *)&(in_RDI->super_SQRefCounted)._uiRef)->nInteger | 0x80000000;
    if (in_RDI[1].super_SQRefCounted._weakref != (SQWeakRef *)0x0) {
      pSVar1 = in_RDI[1].super_SQRefCounted._weakref;
      (*(pSVar1->super_SQRefCounted)._vptr_SQRefCounted[4])(pSVar1,in_RSI);
    }
    pSVar2 = in_RDI[1]._next;
    (*(pSVar2->super_SQRefCounted)._vptr_SQRefCounted[4])(pSVar2,in_RSI);
    for (local_20 = 0; local_20 < (long)pSVar2[3]._sharedstate; local_20 = local_20 + 1) {
      SQSharedState::MarkObject((SQObjectPtr *)in_RDI,in_stack_ffffffffffffffc8);
    }
    for (local_28 = 0; local_28 < (long)pSVar2[4].super_SQRefCounted._uiRef; local_28 = local_28 + 1
        ) {
      SQSharedState::MarkObject((SQObjectPtr *)in_RDI,in_stack_ffffffffffffffc8);
    }
    SQCollectable::RemoveFromChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
    SQCollectable::AddToChain(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void SQClosure::Mark(SQCollectable **chain)
{
    START_MARK()
        if(_base) _base->Mark(chain);
        SQFunctionProto *fp = _function;
        fp->Mark(chain);
        for(SQInteger i = 0; i < fp->_noutervalues; i++) SQSharedState::MarkObject(_outervalues[i], chain);
        for(SQInteger k = 0; k < fp->_ndefaultparams; k++) SQSharedState::MarkObject(_defaultparams[k], chain);
    END_MARK()
}